

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_0::FakeFileReader::add(FakeFileReader *this,StringPtr name,StringPtr content)

{
  StringPtr text;
  StringPtr pathText;
  String *pSVar1;
  File *this_00;
  PathPtr path;
  Path local_68;
  PathPtr local_50;
  Own<const_kj::File> local_40;
  FakeFileReader *local_30;
  FakeFileReader *this_local;
  StringPtr content_local;
  StringPtr name_local;
  
  content_local.content.ptr = (char *)content.content.size_;
  this_local = (FakeFileReader *)content.content.ptr;
  content_local.content.size_ = (size_t)name.content.ptr;
  local_30 = this;
  pSVar1 = (String *)kj::Own<const_kj::Directory>::operator->(&this->root);
  pathText.content.size_ = name.content.size_;
  pathText.content.ptr = (char *)content_local.content.size_;
  kj::Path::evalNative(&local_68,&this->cwd,pathText);
  kj::PathPtr::PathPtr(&local_50,&local_68);
  kj::operator|(CREATE,CREATE_PARENT);
  path.parts.size_ = (size_t)local_50.parts.ptr;
  path.parts.ptr = pSVar1;
  kj::Directory::openFile((Directory *)&local_40,path,(WriteMode)local_50.parts.size_);
  this_00 = kj::Own<const_kj::File>::operator->(&local_40);
  text.content.size_ = (size_t)content_local.content.ptr;
  text.content.ptr = (char *)this_local;
  kj::File::writeAll(this_00,text);
  kj::Own<const_kj::File>::~Own(&local_40);
  kj::Path::~Path(&local_68);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }